

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializePolyobjs(FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  TAngle<double> local_48;
  undefined1 local_40 [8];
  DVector2 delta;
  DAngle angle;
  int data;
  int seg;
  FPolyObj *po;
  int i;
  FArchive *arc_local;
  
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    angle.Degrees._4_4_ = 0x68;
    pFVar2 = FArchive::operator<<(arc,(SDWORD *)((long)&angle.Degrees + 4));
    FArchive::operator<<(pFVar2,&po_NumPolyobjs);
    _data = polyobjs;
    for (po._4_4_ = 0; po._4_4_ < po_NumPolyobjs; po._4_4_ = po._4_4_ + 1) {
      pFVar2 = FArchive::operator<<(arc,&_data->tag);
      pFVar2 = operator<<(pFVar2,&_data->Angle);
      pFVar2 = operator<<(pFVar2,&(_data->StartSpot).pos);
      pFVar2 = operator<<(pFVar2,&_data->interpolation);
      pFVar2 = FArchive::operator<<(pFVar2,&_data->bBlocked);
      FArchive::operator<<(pFVar2,&_data->bHasPortals);
      operator<<(arc,&_data->specialdata);
      _data = _data + 1;
    }
  }
  else {
    TAngle<double>::TAngle((TAngle<double> *)&delta.Y);
    TVector2<double>::TVector2((TVector2<double> *)local_40);
    FArchive::operator<<(arc,(SDWORD *)&angle);
    if (angle.Degrees._0_4_ != 0x68) {
      I_Error("Polyobject marker missing");
    }
    FArchive::operator<<(arc,(SDWORD *)&angle);
    if (angle.Degrees._0_4_ != po_NumPolyobjs) {
      I_Error("UnarchivePolyobjs: Bad polyobj count");
    }
    _data = polyobjs;
    for (po._4_4_ = 0; po._4_4_ < po_NumPolyobjs; po._4_4_ = po._4_4_ + 1) {
      FArchive::operator<<(arc,(SDWORD *)&angle);
      if (angle.Degrees._0_4_ != _data->tag) {
        I_Error("UnarchivePolyobjs: Invalid polyobj tag");
      }
      pFVar2 = operator<<(arc,(DAngle *)&delta.Y);
      pFVar2 = operator<<(pFVar2,(DVector2 *)local_40);
      operator<<(pFVar2,&_data->interpolation);
      FArchive::operator<<(arc,&_data->bBlocked);
      FArchive::operator<<(arc,&_data->bHasPortals);
      if (0x11c3 < SaveVersion) {
        operator<<(arc,&_data->specialdata);
      }
      TAngle<double>::TAngle(&local_48,(TAngle<double> *)&delta.Y);
      FPolyObj::RotatePolyobj(_data,&local_48,true);
      TVector2<double>::operator-=((TVector2<double> *)local_40,&(_data->StartSpot).pos);
      FPolyObj::MovePolyobj(_data,(DVector2 *)local_40,true);
      _data = _data + 1;
    }
  }
  return;
}

Assistant:

void P_SerializePolyobjs (FArchive &arc)
{
	int i;
	FPolyObj *po;

	if (arc.IsStoring ())
	{
		int seg = ASEG_POLYOBJS;
		arc << seg << po_NumPolyobjs;
		for(i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << po->tag << po->Angle << po->StartSpot.pos << po->interpolation << po->bBlocked << po->bHasPortals;
			arc << po->specialdata;
  		}
	}
	else
	{
		int data;
		DAngle angle;
		DVector2 delta;

		arc << data;
		if (data != ASEG_POLYOBJS)
			I_Error ("Polyobject marker missing");

		arc << data;
		if (data != po_NumPolyobjs)
		{
			I_Error ("UnarchivePolyobjs: Bad polyobj count");
		}
		for (i = 0, po = polyobjs; i < po_NumPolyobjs; i++, po++)
		{
			arc << data;
			if (data != po->tag)
			{
				I_Error ("UnarchivePolyobjs: Invalid polyobj tag");
			}
			arc << angle << delta << po->interpolation;
			arc << po->bBlocked;
			arc << po->bHasPortals;
			if (SaveVersion >= 4548)
			{
				arc << po->specialdata;
			}

			po->RotatePolyobj (angle, true);
			delta -= po->StartSpot.pos;
			po->MovePolyobj (delta, true);
		}
	}
}